

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool plutosvg_document_extents(plutosvg_document_t *document,char *id,plutovg_rect_t *extents)

{
  string_t name;
  render_state_t local_90;
  render_context_t local_48;
  
  local_90.parent = (render_state *)0x0;
  local_90.mode = render_mode_bounding;
  local_90.opacity = 1.0;
  local_90.extents.x = 0.0;
  local_90.extents.y = 0.0;
  local_90.extents.w = -1.0;
  local_90.extents.h = -1.0;
  local_90.view_width = document->width;
  local_90.view_height = document->height;
  plutovg_matrix_init_identity(&local_90.matrix);
  if (id == (char *)0x0) {
    local_90.element = document->root_element;
  }
  else {
    local_48.document = (plutosvg_document_t *)id;
    local_48.canvas = (plutovg_canvas_t *)strlen(id);
    local_90.element = find_element(document,(string_t *)&local_48);
    if (local_90.element == (element_t *)0x0) {
      extents->x = 0.0;
      extents->y = 0.0;
      extents->w = 0.0;
      extents->h = 0.0;
      return false;
    }
  }
  local_48.palette_func = (plutosvg_palette_func_t)0x0;
  local_48.closure = (void *)0x0;
  local_48.canvas = (plutovg_canvas_t *)0x0;
  local_48.current_color = (plutovg_color_t *)0x0;
  local_48.document = document;
  render_element(local_90.element,&local_48,&local_90);
  if ((local_90.extents.w < 0.0) || (local_90.extents.h < 0.0)) {
    local_90.extents.x = 0.0;
    local_90.extents.y = 0.0;
    local_90.extents.w = 0.0;
    local_90.extents.h = 0.0;
  }
  else {
  }
  extents->x = local_90.extents.x;
  extents->y = local_90.extents.y;
  extents->w = local_90.extents.w;
  extents->h = local_90.extents.h;
  return true;
}

Assistant:

bool plutosvg_document_extents(const plutosvg_document_t* document, const char* id, plutovg_rect_t* extents)
{
    render_state_t state;
    state.parent = NULL;
    state.mode = render_mode_bounding;
    state.opacity = 1.f;
    state.extents = INVALID_RECT;
    state.view_width = document->width;
    state.view_height = document->height;
    plutovg_matrix_init_identity(&state.matrix);
    if(id == NULL) {
        state.element = document->root_element;
    } else {
        const string_t name = {id, strlen(id)};
        const element_t* element = find_element(document, &name);
        if(element == NULL) {
            *extents = EMPTY_RECT;
            return false;
        }

        state.element = element;
    }

    render_context_t context = {document, NULL, NULL, NULL, NULL};
    render_element(state.element, &context, &state);
    if(IS_INVALID_RECT(state.extents)) {
        *extents = EMPTY_RECT;
    } else {
        *extents = state.extents;
    }

    return true;
}